

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

void A64SysRegMapper_toString(A64SysRegMapper *S,uint32_t Bits,char *result)

{
  bool bVar1;
  char *pcVar2;
  char *X;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *in_RDX;
  uint32_t in_ESI;
  long in_RDI;
  uint i;
  char *Op2S;
  char *CRmS;
  char *CRnS;
  char *Op1S;
  char *Op0S;
  uint32_t Op2;
  uint32_t CRm;
  uint32_t CRn;
  uint32_t Op1;
  uint32_t Op0;
  int dummy;
  uint local_5c;
  undefined8 in_stack_ffffffffffffffb8;
  _Bool isNeg;
  uint64_t in_stack_ffffffffffffffc0;
  
  isNeg = SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0);
  for (local_5c = 0; local_5c < 0x203; local_5c = local_5c + 1) {
    if (SysRegPairs[local_5c].Value == in_ESI) {
      strcpy(in_RDX,SysRegPairs[local_5c].Name);
      return;
    }
  }
  bVar1 = false;
  while (!bVar1) {
    if (in_ESI == 0xff90) {
      strcpy(in_RDX,"cpm_ioacc_ctl_el3");
      return;
    }
    bVar1 = true;
  }
  local_5c = 0;
  while( true ) {
    if (*(ulong *)(in_RDI + 0x10) <= (ulong)local_5c) {
      pcVar2 = utostr(in_stack_ffffffffffffffc0,isNeg);
      X = utostr(in_stack_ffffffffffffffc0,isNeg);
      pcVar3 = utostr((uint64_t)X,isNeg);
      pcVar4 = utostr((uint64_t)X,SUB81((ulong)pcVar3 >> 0x38,0));
      pcVar5 = utostr((uint64_t)X,SUB81((ulong)pcVar3 >> 0x38,0));
      cs_snprintf(in_RDX,0x80,"s3_%s_c%s_c%s_%s",X,pcVar3,pcVar4,pcVar5);
      (*cs_mem_free)(pcVar2);
      (*cs_mem_free)(X);
      (*cs_mem_free)(pcVar3);
      (*cs_mem_free)(pcVar4);
      (*cs_mem_free)(pcVar5);
      return;
    }
    if (*(uint32_t *)(*(long *)(in_RDI + 8) + (ulong)local_5c * 0x10 + 8) == in_ESI) break;
    local_5c = local_5c + 1;
  }
  strcpy(in_RDX,*(char **)(*(long *)(in_RDI + 8) + (ulong)local_5c * 0x10));
  return;
}

Assistant:

void A64SysRegMapper_toString(const A64SysRegMapper *S, uint32_t Bits, char *result)
{
	int dummy;
	uint32_t Op0, Op1, CRn, CRm, Op2;
	char *Op0S, *Op1S, *CRnS, *CRmS, *Op2S;
	unsigned i;

	// First search the registers shared by all
	for (i = 0; i < ARR_SIZE(SysRegPairs); ++i) {
		if (SysRegPairs[i].Value == Bits) {
			strcpy(result, SysRegPairs[i].Name);
			return;
		}
	}

	// Next search for target specific registers
	// if (FeatureBits & AArch64_ProcCyclone) {
	if (true) {
		for (i = 0; i < ARR_SIZE(CycloneSysRegPairs); ++i) {
			if (CycloneSysRegPairs[i].Value == Bits) {
				strcpy(result, CycloneSysRegPairs[i].Name);
				return;
			}
		}
	}

	// Now try the instruction-specific registers (either read-only or
	// write-only).
	for (i = 0; i < S->NumInstPairs; ++i) {
		if (S->InstPairs[i].Value == Bits) {
			strcpy(result, S->InstPairs[i].Name);
			return;
		}
	}

	Op0 = (Bits >> 14) & 0x3;
	Op1 = (Bits >> 11) & 0x7;
	CRn = (Bits >> 7) & 0xf;
	CRm = (Bits >> 3) & 0xf;
	Op2 = Bits & 0x7;

	Op0S = utostr(Op0, false);
	Op1S = utostr(Op1, false);
	CRnS = utostr(CRn, false);
	CRmS = utostr(CRm, false);
	Op2S = utostr(Op2, false);

	//printf("Op1S: %s, CRnS: %s, CRmS: %s, Op2S: %s\n", Op1S, CRnS, CRmS, Op2S);
	dummy = cs_snprintf(result, 128, "s3_%s_c%s_c%s_%s", Op1S, CRnS, CRmS, Op2S);
	(void)dummy;

	cs_mem_free(Op0S);
	cs_mem_free(Op1S);
	cs_mem_free(CRnS);
	cs_mem_free(CRmS);
	cs_mem_free(Op2S);
}